

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_dispel_magic(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  int sn_00;
  CHAR_DATA *ch_00;
  CClass *pCVar4;
  char *pcVar5;
  AFFECT_DATA *pAVar6;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  
  if (ch->fighting == (CHAR_DATA *)0x0) {
    bVar3 = str_cmp(target_name,"");
    if (!bVar3) {
      ch->wait = 0;
      send_to_char("Syntax: cast \'dispel magic\' <target> [spellname].\n\r",ch);
      return;
    }
    if (ch->fighting != (CHAR_DATA *)0x0) goto LAB_00306d10;
  }
  else {
LAB_00306d10:
    bVar3 = str_cmp(target_name,"");
    if (!bVar3) {
      ch_00 = ch->fighting;
      goto LAB_00306d5a;
    }
  }
  ch_00 = (CHAR_DATA *)0x0;
LAB_00306d5a:
  target_name = one_argument(target_name,arg1);
  one_argument(target_name,arg2);
  if ((ch_00 == (CHAR_DATA *)0x0) && (ch_00 = get_char_room(ch,arg1), ch_00 == (CHAR_DATA *)0x0)) {
    ch->wait = 0;
    send_to_char("They aren\'t here.\n\r",ch);
  }
  else {
    pCVar4 = char_data::Class(ch);
    iVar2 = pCVar4->ctype;
    bVar3 = is_npc(ch_00);
    if ((ch_00 != ch && !bVar3) &&
       ((ch->fighting == (CHAR_DATA *)0x0 || (ch_00->fighting == (CHAR_DATA *)0x0)))) {
      pcVar5 = pers(ch,ch_00);
      sprintf(buf,"Die, %s, you sorcerous dog!",pcVar5);
      do_myell(ch_00,buf,ch);
    }
    if (ch_00->fighting == (CHAR_DATA *)0x0 && ch_00 != ch) {
      multi_hit(ch_00,ch,-1);
    }
    if (arg2[0] == '\0') {
      pAVar6 = (AFFECT_DATA *)&ch_00->affected;
      while (pAVar6 = pAVar6->next, pAVar6 != (AFFECT_DATA *)0x0) {
        if ((skill_table[pAVar6->type].dispel & 1) != 0) {
          check_dispel_cancellation(level,ch_00,ch,(int)pAVar6->type,iVar2 == 2,false);
        }
      }
    }
    else {
      sn_00 = find_spell(ch_00,arg2);
      if (0 < sn_00) {
        pAVar6 = (AFFECT_DATA *)&ch_00->affected;
        do {
          pAVar6 = pAVar6->next;
          if (pAVar6 == (AFFECT_DATA *)0x0) {
            return;
          }
          sVar1 = pAVar6->type;
        } while (sn_00 != sVar1);
        if ((sVar1 != 0) && ((skill_table[(int)sVar1].dispel & 1) != 0)) {
          check_dispel_cancellation(level + 3,ch_00,ch,sn_00,iVar2 == 2,false);
        }
      }
    }
  }
  return;
}

Assistant:

void spell_dispel_magic(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg1[MSL], arg2[MSL];
	char buf[MSL];
	CHAR_DATA *victim = nullptr;
	AFFECT_DATA *af;
	bool found = false;
	bool commune = false;
	int spell;

	if (!ch->fighting && !str_cmp(target_name, ""))
	{
		ch->wait = 0;

		send_to_char("Syntax: cast 'dispel magic' <target> [spellname].\n\r", ch);
		return;
	}

	if (ch->fighting && !str_cmp(target_name, ""))
		victim = ch->fighting;

	target_name = one_argument(target_name, arg1);
	one_argument(target_name, arg2);

	if (!victim)
	{
		if ((victim = get_char_room(ch, arg1)) == nullptr)
		{
			ch->wait = 0;

			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (ch->Class()->ctype == CLASS_COMMUNER)
		commune = true;

	if (!is_npc(victim) && (ch != victim) && (!ch->fighting || !victim->fighting))
	{
		sprintf(buf, "Die, %s, you sorcerous dog!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (!victim->fighting && (ch != victim))
		multi_hit(victim, ch, TYPE_UNDEFINED);

	if (arg2[0] == '\0')
	{
		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (skill_table[af->type].dispel & CAN_DISPEL)
			{
				check_dispel_cancellation(level, victim, ch, af->type, commune, false);
				found = true;
			}
		}
	}
	else
	{
		spell = find_spell(victim, arg2);

		if (spell < 1)
			return;

		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (af->type == spell)
				break;
		}

		if (!af || !af->type || !(skill_table[af->type].dispel & CAN_DISPEL))
			return;

		check_dispel_cancellation(level + 3, victim, ch, af->type, commune, false);
	}

	return;
}